

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

char * deqp::gles31::Functional::anon_unknown_1::GLPositionCase::getCaseTypeName(CaseType type)

{
  char *pcStack_10;
  CaseType type_local;
  
  if (type == CASETYPE_VS_TO_TCS) {
    pcStack_10 = "gl_position_vs_to_tcs";
  }
  else if (type == CASETYPE_TCS_TO_TES) {
    pcStack_10 = "gl_position_tcs_to_tes";
  }
  else if (type == CASETYPE_VS_TO_TCS_TO_TES) {
    pcStack_10 = "gl_position_vs_to_tcs_to_tes";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* GLPositionCase::getCaseTypeName (CaseType type)
{
	switch (type)
	{
		case CASETYPE_VS_TO_TCS:			return "gl_position_vs_to_tcs";
		case CASETYPE_TCS_TO_TES:			return "gl_position_tcs_to_tes";
		case CASETYPE_VS_TO_TCS_TO_TES:		return "gl_position_vs_to_tcs_to_tes";
		default:
			DE_ASSERT(false); return DE_NULL;
	}
}